

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

uint Validator::evaluateSolution(Solution *solution)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = constraintS1(solution);
  uVar2 = constraintS2(solution);
  uVar3 = constraintS3(solution);
  uVar4 = constraintS4(solution);
  uVar5 = constraintS5(solution);
  uVar6 = constraintS6(solution);
  uVar7 = constraintS7(solution);
  return uVar7 + uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1;
}

Assistant:

unsigned int Validator::evaluateSolution(const Solution &solution){

    unsigned int sum = 0;

    sum += constraintS1(solution);
    sum += constraintS2(solution);
    sum += constraintS3(solution);
    sum += constraintS4(solution);
    sum += constraintS5(solution);
    sum += constraintS6(solution);
    sum += constraintS7(solution);

    return sum;
}